

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

scan_result * __thiscall
mjs::hoisting_visitor::scan_abi_cxx11_
          (scan_result *__return_storage_ptr__,hoisting_visitor *this,statement *s)

{
  hoisting_visitor hv;
  hoisting_visitor local_48;
  
  local_48.funcs_.
  super__Vector_base<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.funcs_.
  super__Vector_base<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.ids_.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.funcs_.
  super__Vector_base<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.ids_.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.ids_.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  accept<mjs::hoisting_visitor>((statement *)this,&local_48);
  std::
  tuple<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
  ::
  tuple<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>,_true>
            (__return_storage_ptr__,&local_48.ids_,&local_48.funcs_);
  ~hoisting_visitor(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static scan_result scan(const statement& s) {
        hoisting_visitor hv{};
        accept(s, hv);
        return std::tuple(std::move(hv.ids_), std::move(hv.funcs_));
    }